

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTokenTestDoNotAquireToken::Run(BuildTokenTestDoNotAquireToken *this)

{
  Builder *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  string err;
  string local_70;
  string local_50;
  
  pTVar1 = g_current_test;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cat1","");
  this_00 = &(this->super_BuildTokenTest).super_BuildTest.builder_;
  pNVar4 = Builder::AddTarget(this_00,&local_50,&local_70);
  testing::Test::Check
            (pTVar1,pNVar4 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1036,"builder_.AddTarget(\"cat1\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar3 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x1037,"\"\" == err");
  if (bVar2) {
    BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,1,0);
    pTVar1 = g_current_test;
    bVar2 = Builder::Build(this_00,&local_70);
    testing::Test::Check
              (pTVar1,!bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x103c,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x103d,"\"stuck [this is a bug]\" == err");
    testing::Test::Check
              (g_current_test,
               (this->super_BuildTokenTest).token_command_runner_.commands_ran_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               (this->super_BuildTokenTest).token_command_runner_.commands_ran_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x103f,"0u == token_command_runner_.commands_ran_.size()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTokenTest, DoNotAquireToken) {
  // plan should execute one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat1", &err));
  ASSERT_EQ("", err);

  // pretend we can't run anything
  ExpectCanRunMore(1, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(0u, token_command_runner_.commands_ran_.size());
}